

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::erase
          (QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **b,qsizetype n)

{
  Data **__src;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *pQVar1;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **pp_Var2;
  long in_RDX;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *in_RSI;
  long in_RDI;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **e;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>
  *in_stack_ffffffffffffffb0;
  
  __src = &in_RSI->d + in_RDX;
  pQVar1 = (QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)
           QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::begin
                     ((QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)
                      0x960d06);
  if ((in_RSI == pQVar1) &&
     (pp_Var2 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::end
                          (in_stack_ffffffffffffffb0), __src != (Data **)pp_Var2)) {
    *(Data ***)(in_RDI + 8) = __src;
  }
  else {
    pp_Var2 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::end
                        (in_stack_ffffffffffffffb0);
    if (__src != (Data **)pp_Var2) {
      pp_Var2 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::end
                          (in_RSI);
      memmove(in_RSI,__src,((long)pp_Var2 - (long)__src >> 3) << 3);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }